

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

void __thiscall ON_Triangle::ON_Triangle(ON_Triangle *this,double *vertices)

{
  double *p;
  double *p_00;
  ON_3dPoint local_30;
  
  ON_3dPoint::ON_3dPoint(&local_30,vertices);
  this->m_V[0].z = local_30.z;
  this->m_V[0].x = local_30.x;
  this->m_V[0].y = local_30.y;
  p = vertices + 3;
  p_00 = vertices + 6;
  if (vertices == (double *)0x0) {
    p_00 = (double *)0x0;
    p = (double *)0x0;
  }
  ON_3dPoint::ON_3dPoint(&local_30,p);
  this->m_V[1].z = local_30.z;
  this->m_V[1].x = local_30.x;
  this->m_V[1].y = local_30.y;
  ON_3dPoint::ON_3dPoint(&local_30,p_00);
  this->m_V[2].z = local_30.z;
  this->m_V[2].x = local_30.x;
  this->m_V[2].y = local_30.y;
  return;
}

Assistant:

ON_Triangle::ON_Triangle(const double vertices[9])
{
  m_V[0] = ON_3dPoint(vertices);
  m_V[1] = ON_3dPoint(vertices ? vertices+3 : vertices);
  m_V[2] = ON_3dPoint(vertices ? vertices+6 : vertices);
}